

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall google::protobuf::Reflection::MaybePoisonAfterClear(Reflection *this,Message *root)

{
  ExtensionSet *this_00;
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  CppStringType CVar5;
  int iVar6;
  uint32_t uVar7;
  FieldDescriptor *this_01;
  OneofDescriptor *pOVar8;
  Message *pMVar9;
  RepeatedPtrField<google::protobuf::Message> *pRVar10;
  RepeatedPtrIterator<google::protobuf::Message> RVar11;
  RepeatedField<bool> *this_02;
  RepeatedField<double> *this_03;
  RepeatedField<float> *this_04;
  RepeatedField<long> *this_05;
  RepeatedField<int> *this_06;
  RepeatedField<unsigned_long> *this_07;
  RepeatedField<unsigned_int> *this_08;
  MapFieldBase *pMVar12;
  Descriptor *pDVar13;
  FieldDescriptor *pFVar14;
  KeyValue *pKVar15;
  KeyValue *pKVar16;
  reference ppVar17;
  Reflection *this_09;
  int i;
  int i_1;
  uint uVar18;
  ulong uVar19;
  MapDynamicFieldInfo<google::protobuf::Message> *this_10;
  KeyValue *pKVar20;
  Metadata MVar21;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_> iVar22
  ;
  iterator iVar23;
  iterator iVar24;
  bool heap_alloc;
  Message *local_1c0;
  RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
  local_1b8;
  undefined1 local_198 [16];
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_188;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_178;
  FieldDescriptor *local_168;
  Reflection *local_160;
  uint32_t *local_158;
  DescriptorPool *local_150;
  Descriptor *extendee;
  iterator local_140;
  Descriptor *local_130;
  anon_union_8_2_2904990b_for_scope_ local_128;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_120;
  vector<MemBlock,_std::allocator<MemBlock>_> nodes;
  anon_class_24_3_758c1557 local_f8;
  MapDynamicFieldInfo<google::protobuf::Message> local_e0;
  queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  queue;
  MapDynamicFieldInfo<google::protobuf::Message> local_60;
  
  uVar19 = (root->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar19 & 1) != 0) {
    uVar19 = *(ulong *)(uVar19 & 0xfffffffffffffffe);
  }
  heap_alloc = uVar19 == 0;
  nodes.super__Vector_base<MemBlock,_std::allocator<MemBlock>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes.super__Vector_base<MemBlock,_std::allocator<MemBlock>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes.super__Vector_base<MemBlock,_std::allocator<MemBlock>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_160 = (Reflection *)root;
  std::
  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
  ::emplace_back<google::protobuf::Message&>
            ((vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
              *)&nodes,root);
  std::
  queue<google::protobuf::Message*,std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>
  ::queue<std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>,void>
            (&queue);
  local_e0.reflection = local_160;
  std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
  emplace_back<google::protobuf::Message*>
            ((deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>> *)&queue,
             (Message **)&local_e0);
  do {
    if ((queue.c.
         super__Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
         queue.c.
         super__Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) || ((heap_alloc & 1U) != 0)) {
      (*((MessageLite *)&local_160->descriptor_)->_vptr_MessageLite[2])();
      std::_Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::
      ~_Deque_base((_Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                    *)&queue);
      std::vector<MemBlock,_std::allocator<MemBlock>_>::~vector(&nodes);
      return;
    }
    pMVar9 = *queue.c.
              super__Deque_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::pop_front
              (&queue.c);
    local_f8.heap_alloc = &heap_alloc;
    local_f8.nodes = &nodes;
    local_198._0_8_ = &local_f8;
    local_198._12_4_ = 0x400;
    local_1c0 = pMVar9;
    local_f8.queue = &queue;
    MVar21 = Message::GetMetadata(pMVar9);
    this_09 = MVar21.reflection;
    if (0 < (this_09->schema_).weak_field_map_offset_) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                 ,99,"!schema.HasWeakFields()");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_e0,(char (*) [30])"weak fields are not supported");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_e0);
    }
    if ((this_09->schema_).has_bits_offset_ == -1) {
      local_158 = (uint32_t *)0x0;
    }
    else {
      local_158 = GetHasBits(this_09,local_1c0);
    }
    local_130 = (Descriptor *)&this_09->schema_;
    local_120.message_type = this_09->descriptor_;
    local_128 = (anon_union_8_2_2904990b_for_scope_)(this_09->schema_).has_bit_indices_;
    uVar18 = (local_120.message_type)->field_count_;
    if ((local_120.message_type)->field_count_ < 1) {
      uVar18 = 0;
    }
    for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
      this_01 = Descriptor::field(local_120.message_type,(int)uVar19);
      if ((this_01->options_->field_0)._impl_.weak_ == true) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,0x6e,"!field->options().weak()");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_1b8,(char (*) [30])"weak fields are not supported");
        goto LAB_0034cc87;
      }
      if ((local_198._12_4_ != 0xffffffff) &&
         (((uint)local_198._12_4_ >>
           (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_01->type_ * 4) & 0x1f) & 1)
          == 0)) goto LAB_0034c5b9;
      bVar4 = FieldDescriptor::is_repeated(this_01);
      if (!bVar4) {
        pOVar8 = FieldDescriptor::real_containing_oneof(this_01);
        if (pOVar8 == (OneofDescriptor *)0x0) {
          if ((local_158 == (uint32_t *)0x0) ||
             (uVar2 = *(uint *)(&(local_128.containing_oneof)->super_SymbolBase + uVar19 * 4),
             uVar2 == 0xffffffff)) {
            bVar4 = HasFieldSingular(this_09,local_1c0,this_01);
            if (bVar4) goto LAB_0034c2b8;
          }
          else if ((local_158[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
LAB_0034c2b8:
            uVar3 = local_198._0_8_;
            bVar1 = this_01->type_;
            iVar6 = 0x12d;
            if (0x12 < bVar1) goto LAB_0034cc4f;
            if ((0x7e1feU >> (bVar1 & 0x1f) & 1) == 0) {
              iVar6 = 0x12d;
              if ((0xc00U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0034c2e7;
              local_1b8.message = local_1c0;
              local_1b8.reflection = this_09;
              local_1b8.field = this_01;
              pMVar9 = internal::MessageDynamicFieldInfo<google::protobuf::Message,_false>::Mutable
                                 ((MessageDynamicFieldInfo<google::protobuf::Message,_false> *)
                                  &local_1b8,(MessageFactory *)0x0);
              MaybePoisonAfterClear::anon_class_24_3_758c1557::operator()
                        ((anon_class_24_3_758c1557 *)uVar3,pMVar9);
            }
          }
        }
        else {
          pOVar8 = FieldDescriptor::containing_oneof(this_01);
          uVar3 = local_198._0_8_;
          if ((ulong)*(uint *)((long)&(local_1c0->super_MessageLite)._vptr_MessageLite +
                              (long)(int)(((long)pOVar8 -
                                          (long)pOVar8->containing_type_->oneof_decls_) / 0x38) * 4
                              + (ulong)(uint)(this_09->schema_).oneof_case_offset_) ==
              (long)this_01->number_) {
            bVar1 = this_01->type_;
            iVar6 = 0xf6;
            if (0x12 < bVar1) goto LAB_0034cc4f;
            if ((0x7e1feU >> (bVar1 & 0x1f) & 1) == 0) {
              iVar6 = 0xf6;
              if ((0xc00U >> (bVar1 & 0x1f) & 1) == 0) {
LAB_0034c2e7:
                if ((0x1200U >> (bVar1 & 0x1f) & 1) == 0) {
LAB_0034cc4f:
                  internal::Unreachable
                            ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                             ,iVar6);
                }
                FieldDescriptor::cpp_string_type(this_01);
              }
              else {
                local_1b8.message = local_1c0;
                local_1b8.reflection = this_09;
                local_1b8.field = this_01;
                pMVar9 = internal::MessageDynamicFieldInfo<google::protobuf::Message,_true>::Mutable
                                   ((MessageDynamicFieldInfo<google::protobuf::Message,_true> *)
                                    &local_1b8,(MessageFactory *)0x0);
                MaybePoisonAfterClear::anon_class_24_3_758c1557::operator()
                          ((anon_class_24_3_758c1557 *)uVar3,pMVar9);
              }
            }
          }
        }
        goto LAB_0034c5b9;
      }
      switch(this_01->type_) {
      case '\x01':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x7f,"!field->is_map()");
LAB_0034cc87:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_1b8);
        }
        this_03 = GetRawNonOneof<google::protobuf::RepeatedField<double>>(this_09,local_1c0,this_01)
        ;
        RepeatedField<double>::size(this_03);
        break;
      case '\x02':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x80,"!field->is_map()");
          goto LAB_0034cc87;
        }
        this_04 = GetRawNonOneof<google::protobuf::RepeatedField<float>>(this_09,local_1c0,this_01);
        RepeatedField<float>::size(this_04);
        break;
      case '\x03':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x81,"!field->is_map()");
          goto LAB_0034cc87;
        }
        goto LAB_0034c4a7;
      case '\x04':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x82,"!field->is_map()");
          goto LAB_0034cc87;
        }
        goto LAB_0034c501;
      case '\x05':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x83,"!field->is_map()");
          goto LAB_0034cc87;
        }
        goto LAB_0034c4d4;
      case '\x06':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x84,"!field->is_map()");
          goto LAB_0034cc87;
        }
LAB_0034c501:
        this_07 = GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                            (this_09,local_1c0,this_01);
        RepeatedField<unsigned_long>::size(this_07);
        break;
      case '\a':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x85,"!field->is_map()");
          goto LAB_0034cc87;
        }
        goto LAB_0034c5a1;
      case '\b':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x86,"!field->is_map()");
          goto LAB_0034cc87;
        }
        this_02 = GetRawNonOneof<google::protobuf::RepeatedField<bool>>(this_09,local_1c0,this_01);
        RepeatedField<bool>::size(this_02);
        break;
      case '\t':
      case '\f':
        CVar5 = FieldDescriptor::cpp_string_type(this_01);
        if (CVar5 - kView < 3) {
          GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                    (this_09,local_1c0,this_01);
        }
        break;
      case '\n':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          pMVar12 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                              (this_09,local_1c0,this_01);
          iVar6 = internal::MapFieldBase::size(pMVar12);
          if (iVar6 != 0) {
            pDVar13 = FieldDescriptor::message_type(this_01);
            local_168 = Descriptor::map_key(pDVar13);
            pFVar14 = Descriptor::map_value(pDVar13);
            this_10 = &local_60;
            internal::MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                      (this_10,this_09,local_1c0,this_01,local_168,pFVar14,pMVar12);
LAB_0034c709:
            internal::ReflectionVisit::
            VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)
            ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)local_198,*this_10);
          }
        }
        else {
          pRVar10 = GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                              (this_09,local_1c0,this_01);
          if ((pRVar10->super_RepeatedPtrFieldBase).current_size_ != 0) {
            local_1b8.message = local_1c0;
            local_1b8.reflection = this_09;
            local_1b8.field = this_01;
            local_1b8.const_repeated = pRVar10;
            iVar22 = internal::
                     RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
                     ::Mutable(&local_1b8);
            for (RVar11 = iVar22.begin_iterator_.it_; uVar3 = local_198._0_8_,
                RVar11.it_ != iVar22.end_iterator_.it_.it_; RVar11.it_ = RVar11.it_ + 1) {
              pMVar9 = DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar11.it_);
              MaybePoisonAfterClear::anon_class_24_3_758c1557::operator()
                        ((anon_class_24_3_758c1557 *)uVar3,pMVar9);
            }
          }
        }
        break;
      case '\v':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          pMVar12 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                              (this_09,local_1c0,this_01);
          iVar6 = internal::MapFieldBase::size(pMVar12);
          if (iVar6 != 0) {
            pDVar13 = FieldDescriptor::message_type(this_01);
            local_168 = Descriptor::map_key(pDVar13);
            pFVar14 = Descriptor::map_value(pDVar13);
            this_10 = &local_e0;
            internal::MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                      (this_10,this_09,local_1c0,this_01,local_168,pFVar14,pMVar12);
            goto LAB_0034c709;
          }
        }
        else {
          pRVar10 = GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                              (this_09,local_1c0,this_01);
          if ((pRVar10->super_RepeatedPtrFieldBase).current_size_ != 0) {
            local_1b8.message = local_1c0;
            local_1b8.reflection = this_09;
            local_1b8.field = this_01;
            local_1b8.const_repeated = pRVar10;
            iVar22 = internal::
                     RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
                     ::Mutable(&local_1b8);
            for (RVar11 = iVar22.begin_iterator_.it_; uVar3 = local_198._0_8_,
                RVar11.it_ != iVar22.end_iterator_.it_.it_; RVar11.it_ = RVar11.it_ + 1) {
              pMVar9 = DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar11.it_);
              MaybePoisonAfterClear::anon_class_24_3_758c1557::operator()
                        ((anon_class_24_3_758c1557 *)uVar3,pMVar9);
            }
          }
        }
        break;
      case '\r':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x87,"!field->is_map()");
          goto LAB_0034cc87;
        }
LAB_0034c5a1:
        this_08 = GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                            (this_09,local_1c0,this_01);
        RepeatedField<unsigned_int>::size(this_08);
        break;
      case '\x0e':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x88,"!field->is_map()");
          goto LAB_0034cc87;
        }
        goto LAB_0034c4d4;
      case '\x0f':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x89,"!field->is_map()");
          goto LAB_0034cc87;
        }
        goto LAB_0034c4d4;
      case '\x10':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x8a,"!field->is_map()");
          goto LAB_0034cc87;
        }
        goto LAB_0034c4a7;
      case '\x11':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x8b,"!field->is_map()");
          goto LAB_0034cc87;
        }
LAB_0034c4d4:
        this_06 = GetRawNonOneof<google::protobuf::RepeatedField<int>>(this_09,local_1c0,this_01);
        RepeatedField<int>::size(this_06);
        break;
      case '\x12':
        bVar4 = FieldDescriptor::is_map(this_01);
        if (bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x8c,"!field->is_map()");
          goto LAB_0034cc87;
        }
LAB_0034c4a7:
        this_05 = GetRawNonOneof<google::protobuf::RepeatedField<long>>(this_09,local_1c0,this_01);
        RepeatedField<long>::size(this_05);
        break;
      default:
        iVar6 = 0xbb;
        goto LAB_0034cc4f;
      }
LAB_0034c5b9:
    }
    if ((this_09->schema_).extensions_offset_ != -1) {
      uVar7 = internal::ReflectionSchema::GetExtensionSetOffset((ReflectionSchema *)local_130);
      this_00 = (ExtensionSet *)
                ((long)&(local_1c0->super_MessageLite)._vptr_MessageLite + (ulong)uVar7);
      extendee = this_09->descriptor_;
      local_150 = this_09->descriptor_pool_;
      if (*(short *)((long)&(local_1c0->super_MessageLite)._internal_metadata_.ptr_ +
                    (ulong)uVar7 + 2) < 0) {
        iVar23 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                 ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                          *)(this_00->map_).flat);
        iVar24 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                 ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                        *)(this_00->map_).flat);
        local_140.node_ = iVar24.node_;
        local_1b8.reflection = (Reflection *)(local_198 + 0xc);
        local_1b8.message = (Message *)local_198;
        local_1b8.field = (FieldDescriptor *)&local_150;
        local_1b8.const_repeated = (RepeatedPtrField<google::protobuf::Message> *)&extendee;
        local_140.position_ = iVar24.position_;
        local_178._12_4_ = local_188._12_4_;
        local_188.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              *)iVar23.node_;
        local_188.position_ = iVar23.position_;
        local_178.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              *)iVar23.node_;
        local_178.position_ = iVar23.position_;
        for (uVar18 = 0;
            bVar4 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator!=(&local_178,&local_140), bVar4 && uVar18 < 0x10; uVar18 = uVar18 + 1
            ) {
          ppVar17 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_178);
          internal::ExtensionSet::Extension::PrefetchPtr(&ppVar17->second);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&local_178);
        }
        while (bVar4 = absl::lts_20250127::container_internal::
                       btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                       ::operator!=(&local_178,&local_140), bVar4) {
          ppVar17 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_188);
          iVar6 = ppVar17->first;
          ppVar17 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_188);
          internal::ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_1b8,iVar6,&ppVar17->second);
          ppVar17 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_178);
          internal::ExtensionSet::Extension::PrefetchPtr(&ppVar17->second);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&local_188);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&local_178);
        }
        while (bVar4 = absl::lts_20250127::container_internal::
                       btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                       ::operator!=(&local_188,&local_140), bVar4) {
          ppVar17 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_188);
          iVar6 = ppVar17->first;
          ppVar17 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator*(&local_188);
          internal::ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_1b8,iVar6,&ppVar17->second);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
          ::increment(&local_188);
        }
      }
      else {
        pKVar15 = internal::ExtensionSet::flat_begin(this_00);
        pKVar16 = internal::ExtensionSet::flat_end(this_00);
        local_1b8.reflection = (Reflection *)(local_198 + 0xc);
        local_1b8.message = (Message *)local_198;
        local_1b8.field = (FieldDescriptor *)&local_150;
        local_1b8.const_repeated = (RepeatedPtrField<google::protobuf::Message> *)&extendee;
        pKVar20 = pKVar15;
        for (uVar18 = 0; (pKVar20 != pKVar16 && (uVar18 < 0x10)); uVar18 = uVar18 + 1) {
          internal::ExtensionSet::Extension::PrefetchPtr(&pKVar20->second);
          pKVar20 = pKVar20 + 1;
        }
        for (; pKVar20 != pKVar16; pKVar20 = pKVar20 + 1) {
          internal::ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_1b8,pKVar15->first,&pKVar15->second);
          internal::ExtensionSet::Extension::PrefetchPtr(&pKVar20->second);
          pKVar15 = pKVar15 + 1;
        }
        for (; pKVar15 != pKVar16; pKVar15 = pKVar15 + 1) {
          internal::ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0>(google::protobuf::Message&,google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_1b8,pKVar15->first,&pKVar15->second);
        }
      }
    }
  } while( true );
}

Assistant:

void Reflection::MaybePoisonAfterClear(Message& root) const {
  struct MemBlock {
    explicit MemBlock(Message& msg)
        : ptr(static_cast<void*>(&msg)), size(GetSize(msg)) {}

    static uint32_t GetSize(const Message& msg) {
      return msg.GetReflection()->schema_.GetObjectSize();
    }

    void* ptr;
    uint32_t size;
  };

  bool heap_alloc = root.GetArena() == nullptr;
  std::vector<MemBlock> nodes;

#ifdef __cpp_if_constexpr
  nodes.emplace_back(root);

  std::queue<Message*> queue;
  queue.push(&root);

  while (!queue.empty() && !heap_alloc) {
    Message* curr = queue.front();
    queue.pop();
    internal::VisitMutableMessageFields(*curr, [&](Message& msg) {
      if (msg.GetArena() == nullptr) {
        heap_alloc = true;
        return;
      }

      nodes.emplace_back(msg);
      // Also visits child messages.
      queue.push(&msg);
    });
  }
#endif

  root.Clear();

  // Heap allocated oneof messages will be freed on clear. So, poisoning
  // afterwards may cause use-after-free. Bailout.
  if (heap_alloc) return;

  for (auto it : nodes) {
    (void)it;
    internal::PoisonMemoryRegion(it.ptr, it.size);
  }
}